

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O1

void __thiscall tst_qpromise_operators::copy_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  int *piVar3;
  PromiseDataBase<void,_void_()> *pPVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar5;
  char cVar6;
  PromiseData<void> *pPVar7;
  QObject *pQVar8;
  int *piVar9;
  QEvent *pQVar10;
  PromiseDataBase<void,_void_()> *this_00;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  PromiseResolver<void> resolver;
  QPromise<void> local_80;
  QPromise<void> p0;
  QPromiseBase<void> local_40;
  
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  pPVar7 = (PromiseData<void> *)operator_new(0x58);
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011cb48;
  QReadWriteLock::QReadWriteLock(&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011cad0;
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_80.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ca68;
  local_80.super_QPromiseBase<void>.m_d.d = pPVar7;
  p0.super_QPromiseBase<void>.m_d.d = pPVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_80);
  local_80.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  if (local_80.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_80.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  piVar3 = (int *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  piVar11 = (int *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + 1;
    UNLOCK();
    LOCK();
    *piVar11 = *piVar11 + 1;
    UNLOCK();
  }
  pQVar8 = (QObject *)QThread::currentThread();
  if (pQVar8 == (QObject *)0x0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8);
  }
  if (piVar9 != (int *)0x0) {
    if ((pQVar8 != (QObject *)0x0) && (piVar9[1] != 0)) {
      cVar6 = QThread::isFinished();
      if (cVar6 == '\0') {
        if (piVar9[1] == 0) {
          pQVar8 = (QObject *)(QThread *)0x0;
        }
        pQVar8 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar8);
        if (pQVar8 == (QObject *)0x0) {
          cVar6 = QCoreApplication::closingDown();
          if (cVar6 != '\0') goto LAB_0010734e;
        }
        pQVar10 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(pQVar10,None);
        *(undefined ***)pQVar10 = &PTR__Event_0011c930;
        *(int **)(pQVar10 + 0x10) = piVar11;
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar8,pQVar10,0);
      }
    }
LAB_0010734e:
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      operator_delete(piVar9);
    }
  }
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11,0x10);
    }
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11,0x10);
    }
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3,0x10);
    }
  }
  piVar3 = (int *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if ((*piVar3 == 0) &&
       ((void *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_) != (void *)0x0)) {
      operator_delete((void *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_),0x10);
    }
  }
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ca68;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011cb48;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011cad0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_80.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ca68;
  local_80.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_80);
  local_80.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  if (&(local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar2 = &((local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_80.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  piVar3 = (int *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  pQVar8 = (QObject *)QThread::currentThread();
  if (pQVar8 == (QObject *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8);
  }
  if (piVar11 == (int *)0x0) goto LAB_00107535;
  if ((pQVar8 != (QObject *)0x0) && (piVar11[1] != 0)) {
    cVar6 = QThread::isFinished();
    if (cVar6 == '\0') {
      if (piVar11[1] == 0) {
        pQVar8 = (QObject *)(QThread *)0x0;
      }
      pQVar8 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar8);
      if (pQVar8 == (QObject *)0x0) {
        cVar6 = QCoreApplication::closingDown();
        if (cVar6 != '\0') goto LAB_00107527;
      }
      pQVar10 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(pQVar10,None);
      *(undefined ***)pQVar10 = &PTR__Event_0011c978;
      *(int **)(pQVar10 + 0x10) = piVar3;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar8,pQVar10,0);
    }
  }
LAB_00107527:
  LOCK();
  *piVar11 = *piVar11 + -1;
  UNLOCK();
  if (*piVar11 == 0) {
    operator_delete(piVar11);
  }
LAB_00107535:
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3,0x10);
    }
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3,0x10);
    }
  }
  piVar3 = (int *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if ((*piVar3 == 0) &&
       ((void *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_) != (void *)0x0)) {
      operator_delete((void *)CONCAT71(resolver.m_d.d._1_7_,resolver.m_d.d._0_1_),0x10);
    }
  }
  bVar14 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> == this_00;
  resolver.m_d.d._0_1_ = 0;
  local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ = bVar14;
  pcVar12 = QTest::toString<bool>((bool *)&local_80);
  pcVar13 = QTest::toString<bool>((bool *)&resolver);
  cVar6 = QTest::compare_helper
                    (!bVar14,"Compared values are not the same",pcVar12,pcVar13,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x82);
  if (cVar6 != '\0') {
    bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                       (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = 1;
    local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ = bVar14;
    pcVar12 = QTest::toString<bool>((bool *)&local_80);
    pcVar13 = QTest::toString<bool>((bool *)&resolver);
    cVar6 = QTest::compare_helper
                      (bVar14,"Compared values are not the same",pcVar12,pcVar13,"p0.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x83);
    if (cVar6 != '\0') {
      bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      resolver.m_d.d._0_1_ = 1;
      local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ = bVar14;
      pcVar12 = QTest::toString<bool>((bool *)&local_80);
      pcVar13 = QTest::toString<bool>((bool *)&resolver);
      cVar6 = QTest::compare_helper
                        (bVar14,"Compared values are not the same",pcVar12,pcVar13,"p1.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x84);
      if (cVar6 != '\0') {
        QVar5 = p0.super_QPromiseBase<void>.m_d;
        if (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> != this_00) {
          LOCK();
          (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          QVar5.d = (PromiseData<void> *)this_00;
          if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
            LOCK();
            pQVar2 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                      super_QSharedData;
            (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i == 0) {
              pPVar4 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
              p0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
              (*pPVar4->_vptr_PromiseDataBase[1])();
              QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
            }
          }
        }
        p0.super_QPromiseBase<void>.m_d.d = QVar5.d;
        QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
        local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ =
             &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> == this_00;
        resolver.m_d.d._0_1_ = 1;
        pcVar12 = QTest::toString<bool>((bool *)&local_80);
        pcVar13 = QTest::toString<bool>((bool *)&resolver);
        cVar6 = QTest::compare_helper
                          (&(QVar5.d)->super_PromiseDataBase<void,_void_()> == this_00,
                           "Compared values are not the same",pcVar12,pcVar13,"p0 == p1","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x88);
        if (cVar6 != '\0') {
          bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                             (&(p0.super_QPromiseBase<void>.m_d.d)->
                               super_PromiseDataBase<void,_void_()>);
          resolver.m_d.d._0_1_ = 1;
          local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ = bVar14;
          pcVar12 = QTest::toString<bool>((bool *)&local_80);
          pcVar13 = QTest::toString<bool>((bool *)&resolver);
          cVar6 = QTest::compare_helper
                            (bVar14,"Compared values are not the same",pcVar12,pcVar13,
                             "p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x89);
          if (cVar6 != '\0') {
            bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
            resolver.m_d.d._0_1_ = 1;
            local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ = bVar14;
            pcVar12 = QTest::toString<bool>((bool *)&local_80);
            pcVar13 = QTest::toString<bool>((bool *)&resolver);
            cVar6 = QTest::compare_helper
                              (bVar14,"Compared values are not the same",pcVar12,pcVar13,
                               "p1.isPending()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                               ,0x8a);
            if (cVar6 != '\0') {
              QtPromise::QPromiseBase<void>::wait(&local_40,&p0);
              local_40._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
              if (local_40.m_d.d != (PromiseData<void> *)0x0) {
                LOCK();
                pQVar2 = &((local_40.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData
                ;
                (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i =
                     (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int>._M_i == 0) &&
                   (local_40.m_d.d != (PromiseData<void> *)0x0)) {
                  (*((local_40.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase
                    [1])();
                }
              }
              QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
              bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                                 (&(p0.super_QPromiseBase<void>.m_d.d)->
                                   super_PromiseDataBase<void,_void_()>);
              local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ =
                   ~bVar14 & ((QVar5.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                             _M_exception_object == (void *)0x0;
              resolver.m_d.d._0_1_ = 1;
              bVar14 = QTest::qCompare<bool,bool>
                                 ((bool *)&local_80,(bool *)&resolver,"p0.isFulfilled()","true",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                  ,0x8e);
              if (bVar14) {
                bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
                local_80.super_QPromiseBase<void>._vptr_QPromiseBase._0_1_ =
                     ~bVar14 & (this_00->m_error).m_data._M_exception_object == (void *)0x0;
                resolver.m_d.d._0_1_ = 1;
                QTest::qCompare<bool,bool>
                          ((bool *)&local_80,(bool *)&resolver,"p1.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x8f);
              }
            }
          }
        }
      }
    }
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::move()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1), 42);

    p0 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1), 43);
}